

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Verify(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nTimeLim;
  char *pcVar3;
  uint fVerbose;
  uint fSeq;
  char *pcVar4;
  uint local_3c;
  
  nTimeLim = 0;
  Extra_UtilGetoptReset();
  local_3c = 1000;
  fSeq = 0;
  fVerbose = 0;
  do {
    while( true ) {
      while( true ) {
        while (iVar2 = Extra_UtilGetopt(argc,argv,"CTsvh"), iVar1 = globalUtilOptind, iVar2 == 0x76)
        {
          fVerbose = fVerbose ^ 1;
        }
        if (iVar2 == -1) {
          if (globalUtilOptind + 1 == argc) {
            pcVar3 = argv[globalUtilOptind];
            Extra_FileNameCorrectPath(pcVar3);
            printf("Taking spec from file \"%s\".\n",pcVar3);
          }
          else {
            pcVar3 = (char *)0x0;
          }
          Gia_ManVerifyWithBoxes(pAbc->pGia,local_3c,nTimeLim,fSeq,fVerbose,pcVar3);
          return 0;
        }
        if (iVar2 != 0x73) break;
        fSeq = fSeq ^ 1;
      }
      if (iVar2 == 0x54) break;
      if (iVar2 != 0x43) goto LAB_002114cb;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_002114c1:
        Abc_Print(-1,pcVar3);
        goto LAB_002114cb;
      }
      local_3c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar1 + 1;
      if ((int)local_3c < 0) goto LAB_002114cb;
    }
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-T\" should be followed by an integer.\n";
      goto LAB_002114c1;
    }
    nTimeLim = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
  } while (-1 < (int)nTimeLim);
LAB_002114cb:
  Abc_Print(-2,"usage: &verify [-CT num] [-svh] <file>\n");
  Abc_Print(-2,"\t         performs verification of combinational design\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",(ulong)local_3c);
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",(ulong)nTimeLim);
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (fSeq == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-s     : toggle using sequential verification [default = %s]\n",pcVar3);
  if (fVerbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : optional file name with the spec [default = not used]\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Verify( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileSpec = NULL;
    int c, nBTLimit = 1000, nTimeLim = 0, fSeq = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeLim < 0 )
                goto usage;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
    {
        pFileSpec = argv[globalUtilOptind];
        Extra_FileNameCorrectPath( pFileSpec );
        printf( "Taking spec from file \"%s\".\n", pFileSpec );
    }
    Gia_ManVerifyWithBoxes( pAbc->pGia, nBTLimit, nTimeLim, fSeq, fVerbose, pFileSpec );
    return 0;

usage:
    Abc_Print( -2, "usage: &verify [-CT num] [-svh] <file>\n" );
    Abc_Print( -2, "\t         performs verification of combinational design\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n",  nTimeLim );
    Abc_Print( -2, "\t-s     : toggle using sequential verification [default = %s]\n",  fSeq? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n",                 fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : optional file name with the spec [default = not used]\n" );
    return 1;
}